

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Relations.cpp
# Opt level: O1

Type dg::vr::Relations::getNonStrict(Type type)

{
  uint uVar1;
  
  uVar1 = type - SLT;
  if ((uVar1 < 7) && ((0x55U >> (uVar1 & 0x1f) & 1) != 0)) {
    return *(Type *)(&DAT_00102148 + (ulong)uVar1 * 4);
  }
  abort();
}

Assistant:

Relations::Type Relations::getNonStrict(Type type) {
    switch (type) {
    case Relations::SLT:
        return Relations::SLE;
    case Relations::ULT:
        return Relations::ULE;
    case Relations::SGT:
        return Relations::SGE;
    case Relations::UGT:
        return Relations::UGE;
    default:
        assert(0 && "no nonstrict variant");
        abort();
    }
}